

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalNinjaGenerator.cxx
# Opt level: O3

void __thiscall cmGlobalNinjaGenerator::WriteFolderTargets(cmGlobalNinjaGenerator *this,ostream *os)

{
  cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType> *pcVar1;
  size_t __n;
  pointer ppcVar2;
  cmGeneratorTarget *this_00;
  pointer pcVar3;
  _Base_ptr p_Var4;
  cmState *pcVar5;
  cmState *pcVar6;
  undefined8 uVar7;
  bool bVar8;
  int iVar9;
  TargetType TVar10;
  string *psVar11;
  _Base_ptr p_Var12;
  pointer ppcVar13;
  cmState *pcVar14;
  pointer ppcVar15;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str_1;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
  targetsPerFolder;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  undefined1 local_1e8 [40];
  cmGlobalNinjaGenerator *local_1c0;
  ostream *local_1b8;
  string *local_1b0;
  cmLocalGenerator *local_1a8;
  mapped_type *local_1a0;
  pointer local_198;
  pointer local_190;
  char *local_188;
  size_type local_180;
  char local_178 [8];
  undefined8 uStack_170;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
  local_168;
  undefined1 local_138 [32];
  _Alloc_hider _Stack_118;
  size_type local_110;
  char local_108 [16];
  pointer local_f8;
  pointer pbStack_f0;
  pointer local_e8;
  pointer pbStack_e0;
  pointer local_d8;
  pointer pbStack_d0;
  cmState *local_c8;
  cmState *pcStack_c0;
  _Base_ptr local_b8;
  pointer pbStack_b0;
  pointer local_a8;
  pointer pbStack_a0;
  pointer local_98;
  pointer pbStack_90;
  pointer local_88;
  _Rb_tree_node_base local_78;
  size_t local_58;
  _Alloc_hider local_50;
  size_type local_48;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_40;
  
  std::__ostream_insert<char,std::char_traits<char>>
            (os,"# =============================================================================\n",
             0x50);
  local_1b8 = os;
  std::__ostream_insert<char,std::char_traits<char>>(os,"# Folder targets.\n\n",0x13);
  local_1b0 = cmLocalGenerator::GetBinaryDirectory_abi_cxx11_
                        (*(this->super_cmGlobalCommonGenerator).super_cmGlobalGenerator.
                          LocalGenerators.
                          super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  local_168._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_168._M_impl.super__Rb_tree_header._M_header;
  local_168._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_168._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_168._M_impl.super__Rb_tree_header._M_node_count = 0;
  ppcVar15 = (this->super_cmGlobalCommonGenerator).super_cmGlobalGenerator.LocalGenerators.
             super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>._M_impl.
             super__Vector_impl_data._M_start;
  local_198 = (this->super_cmGlobalCommonGenerator).super_cmGlobalGenerator.LocalGenerators.
              super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>._M_impl.
              super__Vector_impl_data._M_finish;
  local_1c0 = this;
  local_168._M_impl.super__Rb_tree_header._M_header._M_right =
       local_168._M_impl.super__Rb_tree_header._M_header._M_left;
  if (ppcVar15 != local_198) {
    pcVar1 = (cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType> *)(local_138 + 0x10);
    do {
      local_1a8 = *ppcVar15;
      cmLocalGenerator::GetStateSnapshot((cmStateSnapshot *)local_1e8,local_1a8);
      cmStateSnapshot::GetDirectory((cmStateDirectory *)local_138,(cmStateSnapshot *)local_1e8);
      psVar11 = cmStateDirectory::GetCurrentBinary_abi_cxx11_((cmStateDirectory *)local_138);
      __n = psVar11->_M_string_length;
      if ((__n != local_1b0->_M_string_length) ||
         ((__n != 0 &&
          (iVar9 = bcmp((psVar11->_M_dataplus)._M_p,(local_1b0->_M_dataplus)._M_p,__n), iVar9 != 0))
         )) {
        local_190 = ppcVar15;
        local_1a0 = std::
                    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                    ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                                  *)&local_168,psVar11);
        ppcVar2 = (local_1a8->GeneratorTargets).
                  super__Vector_base<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>.
                  _M_impl.super__Vector_impl_data._M_finish;
        for (ppcVar13 = (local_1a8->GeneratorTargets).
                        super__Vector_base<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>
                        ._M_impl.super__Vector_impl_data._M_start; ppcVar13 != ppcVar2;
            ppcVar13 = ppcVar13 + 1) {
          this_00 = *ppcVar13;
          TVar10 = cmGeneratorTarget::GetType(this_00);
          if (TVar10 < GLOBAL_TARGET) {
            local_138._0_8_ = pcVar1;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_138,"EXCLUDE_FROM_ALL","");
            bVar8 = cmGeneratorTarget::GetPropertyAsBool(this_00,(string *)local_138);
            if ((cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType> *)local_138._0_8_ !=
                pcVar1) {
              operator_delete((void *)local_138._0_8_,CONCAT71(local_138._17_7_,local_138[0x10]) + 1
                             );
            }
            if (!bVar8) {
              psVar11 = cmGeneratorTarget::GetName_abi_cxx11_(this_00);
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::push_back(local_1a0,psVar11);
            }
          }
        }
        cmLocalGenerator::GetStateSnapshot((cmStateSnapshot *)local_138,local_1a8);
        cmStateSnapshot::GetChildren
                  ((vector<cmStateSnapshot,_std::allocator<cmStateSnapshot>_> *)local_1e8,
                   (cmStateSnapshot *)local_138);
        uVar7 = local_1e8._8_8_;
        for (pcVar14 = (cmState *)local_1e8._0_8_; pcVar14 != (cmState *)uVar7;
            pcVar14 = (cmState *)
                      &(pcVar14->PropertyDefinitions)._M_t._M_impl.super__Rb_tree_header._M_header.
                       _M_left) {
          cmStateSnapshot::GetDirectory((cmStateDirectory *)local_138,(cmStateSnapshot *)pcVar14);
          psVar11 = cmStateDirectory::GetCurrentBinary_abi_cxx11_((cmStateDirectory *)local_138);
          pcVar3 = (psVar11->_M_dataplus)._M_p;
          local_138._0_8_ = pcVar1;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_138,pcVar3,pcVar3 + psVar11->_M_string_length);
          std::__cxx11::string::append((char *)local_138);
          psVar11 = ConvertToNinjaPath(local_1c0,(string *)local_138);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back(local_1a0,psVar11);
          if ((cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType> *)local_138._0_8_ !=
              pcVar1) {
            operator_delete((void *)local_138._0_8_,CONCAT71(local_138._17_7_,local_138[0x10]) + 1);
          }
        }
        ppcVar15 = local_190;
        if ((cmState *)local_1e8._0_8_ != (cmState *)0x0) {
          operator_delete((void *)local_1e8._0_8_,local_1e8._16_8_ - local_1e8._0_8_);
          ppcVar15 = local_190;
        }
      }
      ppcVar15 = ppcVar15 + 1;
    } while (ppcVar15 != local_198);
    if (local_168._M_impl.super__Rb_tree_header._M_node_count != 0) {
      local_188 = local_178;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_188,"phony","");
      _Stack_118._M_p = local_108;
      local_138._8_8_ = 0;
      local_138[0x10] = '\0';
      if (local_188 == local_178) {
        local_108[8] = (undefined1)uStack_170;
        local_108[9] = uStack_170._1_1_;
        local_108[10] = uStack_170._2_1_;
        local_108[0xb] = uStack_170._3_1_;
        local_108[0xc] = uStack_170._4_1_;
        local_108[0xd] = uStack_170._5_1_;
        local_108[0xe] = uStack_170._6_1_;
        local_108[0xf] = uStack_170._7_1_;
      }
      else {
        _Stack_118._M_p = local_188;
      }
      local_110 = local_180;
      local_180 = 0;
      local_178[0] = '\0';
      local_78._M_left = &local_78;
      local_78._M_color = _S_red;
      local_78._M_parent = (_Base_ptr)0x0;
      local_f8 = (pointer)0x0;
      pbStack_f0 = (pointer)0x0;
      local_e8 = (pointer)0x0;
      pbStack_e0 = (pointer)0x0;
      local_d8 = (pointer)0x0;
      pbStack_d0 = (pointer)0x0;
      local_c8 = (cmState *)0x0;
      pcStack_c0 = (cmState *)0x0;
      local_b8 = (_Base_ptr)0x0;
      pbStack_b0 = (pointer)0x0;
      local_a8 = (pointer)0x0;
      pbStack_a0 = (pointer)0x0;
      local_98 = (pointer)0x0;
      pbStack_90 = (pointer)0x0;
      local_88 = (pointer)0x0;
      local_58 = 0;
      local_50._M_p = (pointer)&local_40;
      local_48 = 0;
      local_40._M_local_buf[0] = '\0';
      local_188 = local_178;
      local_138._0_8_ = pcVar1;
      local_78._M_right = local_78._M_left;
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<char_const(&)[1]>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_f8,
                 (char (*) [1])0x550d1e);
      if ((_Rb_tree_header *)local_168._M_impl.super__Rb_tree_header._M_header._M_left !=
          &local_168._M_impl.super__Rb_tree_header) {
        pcVar14 = (cmState *)(local_1e8 + 0x10);
        p_Var12 = local_168._M_impl.super__Rb_tree_header._M_header._M_left;
        do {
          std::__ostream_insert<char,std::char_traits<char>>
                    (local_1b8,
                     "# =============================================================================\n"
                     ,0x50);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_1e8,"Folder: ",
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         (p_Var12 + 1));
          std::__cxx11::string::operator=((string *)local_138,(string *)local_1e8);
          if ((cmState *)local_1e8._0_8_ != pcVar14) {
            operator_delete((void *)local_1e8._0_8_,(ulong)(local_1e8._16_8_ + 1));
          }
          local_1e8._0_8_ = pcVar14;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_1e8,*(long *)(p_Var12 + 1),
                     (long)&(p_Var12[1]._M_parent)->_M_color + *(long *)(p_Var12 + 1));
          std::__cxx11::string::append(local_1e8);
          ConvertToNinjaPath(local_1c0,(string *)local_1e8);
          std::__cxx11::string::_M_assign((string *)local_f8);
          if ((cmState *)local_1e8._0_8_ != pcVar14) {
            operator_delete((void *)local_1e8._0_8_,(ulong)(local_1e8._16_8_ + 1));
          }
          pcVar5 = *(cmState **)(p_Var12 + 2);
          pcVar6 = (cmState *)p_Var12[2]._M_parent;
          p_Var4 = p_Var12[2]._M_left;
          local_1e8._0_8_ = local_c8;
          local_1e8._8_8_ = pcStack_c0;
          local_1e8._16_8_ = local_b8;
          *(undefined8 *)(p_Var12 + 2) = 0;
          p_Var12[2]._M_parent = (_Base_ptr)0x0;
          p_Var12[2]._M_left = (_Base_ptr)0x0;
          local_c8 = pcVar5;
          pcStack_c0 = pcVar6;
          local_b8 = p_Var4;
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)local_1e8);
          WriteBuild(local_1c0,local_1b8,(cmNinjaBuild *)local_138,0,(bool *)0x0);
          p_Var12 = (_Base_ptr)std::_Rb_tree_increment(p_Var12);
        } while ((_Rb_tree_header *)p_Var12 != &local_168._M_impl.super__Rb_tree_header);
      }
      cmNinjaBuild::~cmNinjaBuild((cmNinjaBuild *)local_138);
    }
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
  ::~_Rb_tree(&local_168);
  return;
}

Assistant:

void cmGlobalNinjaGenerator::WriteFolderTargets(std::ostream& os)
{
  cmGlobalNinjaGenerator::WriteDivider(os);
  os << "# Folder targets.\n\n";

  std::string const& rootBinaryDir =
    this->LocalGenerators[0]->GetBinaryDirectory();

  std::map<std::string, cmNinjaDeps> targetsPerFolder;
  for (cmLocalGenerator const* lg : this->LocalGenerators) {
    std::string const& currentBinaryFolder(
      lg->GetStateSnapshot().GetDirectory().GetCurrentBinary());

    // Do not generate a rule for the root binary dir.
    if (currentBinaryFolder == rootBinaryDir) {
      continue;
    }

    // The directory-level rule should depend on the target-level rules
    // for all targets in the directory.
    cmNinjaDeps& folderTargets = targetsPerFolder[currentBinaryFolder];
    for (auto gt : lg->GetGeneratorTargets()) {
      cmStateEnums::TargetType const type = gt->GetType();
      if ((type == cmStateEnums::EXECUTABLE ||
           type == cmStateEnums::STATIC_LIBRARY ||
           type == cmStateEnums::SHARED_LIBRARY ||
           type == cmStateEnums::MODULE_LIBRARY ||
           type == cmStateEnums::OBJECT_LIBRARY ||
           type == cmStateEnums::UTILITY) &&
          !gt->GetPropertyAsBool("EXCLUDE_FROM_ALL")) {
        folderTargets.push_back(gt->GetName());
      }
    }

    // The directory-level rule should depend on the directory-level
    // rules of the subdirectories.
    for (cmStateSnapshot const& state : lg->GetStateSnapshot().GetChildren()) {
      std::string const& currentBinaryDir =
        state.GetDirectory().GetCurrentBinary();
      folderTargets.push_back(
        this->ConvertToNinjaPath(currentBinaryDir + "/all"));
    }
  }

  if (!targetsPerFolder.empty()) {
    cmNinjaBuild build("phony");
    build.Outputs.emplace_back("");
    for (auto& it : targetsPerFolder) {
      cmGlobalNinjaGenerator::WriteDivider(os);
      std::string const& currentBinaryDir = it.first;

      // Setup target
      build.Comment = "Folder: " + currentBinaryDir;
      build.Outputs[0] = this->ConvertToNinjaPath(currentBinaryDir + "/all");
      build.ExplicitDeps = std::move(it.second);
      // Write target
      this->WriteBuild(os, build);
    }
  }
}